

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O2

void __thiscall GlobOpt::UpdateObjPtrValueType(GlobOpt *this,Opnd *opnd,Instr *instr)

{
  Sym *this_00;
  Loop *loop;
  EquivalentTypeSet *this_01;
  code *pcVar1;
  bool bVar2;
  ValueType VVar3;
  TypeId TVar4;
  BOOL BVar5;
  SymOpnd *this_02;
  undefined4 *puVar6;
  PropertySymOpnd *this_03;
  StackSym *pSVar7;
  Value *value;
  Value *pVVar8;
  JsTypeValueInfo *pJVar9;
  JITType *pJVar10;
  JITTypeHandler *pJVar11;
  uint16 i;
  ushort index;
  JITTypeHolderBase<void> local_48;
  JITTypeHolder type;
  ValueType newValueType;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType objValueType;
  
  bVar2 = IR::Opnd::IsSymOpnd(opnd);
  if (!bVar2) {
    return;
  }
  this_02 = IR::Opnd::AsSymOpnd(opnd);
  bVar2 = IR::SymOpnd::IsPropertySymOpnd(this_02);
  if (!bVar2) {
    return;
  }
  bVar2 = IR::Instr::HasTypeCheckBailOut(instr);
  if (!bVar2) {
    return;
  }
  if (instr->m_opcode != CheckFixedFld) {
    if (this->prePassLoop == (Loop *)0x0) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x80e,
                       "(instr->m_opcode == Js::OpCode::CheckFixedFld || !this->IsLoopPrePass())",
                       "instr->m_opcode == Js::OpCode::CheckFixedFld || !this->IsLoopPrePass()");
    if (!bVar2) goto LAB_0046dce0;
    *puVar6 = 0;
    if (instr->m_opcode != CheckFixedFld) {
      return;
    }
  }
  this_03 = IR::Opnd::AsPropertySymOpnd(opnd);
  pSVar7 = IR::PropertySymOpnd::GetObjectSym(this_03);
  value = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,&pSVar7->super_Sym);
  if (value == (Value *)0x0) {
    return;
  }
  local_32[0] = (value->valueInfo->super_ValueType).field_0;
  bVar2 = ValueType::IsDefinite((ValueType *)&local_32[0].field_0);
  if (bVar2) {
    return;
  }
  this_00 = value->valueInfo->symStore;
  if (((this_00 != (Sym *)0x0) && (this_00->m_kind == SymKindStack)) &&
     (pSVar7 = Sym::AsStackSym(this_00), (pSVar7->field_0x1a & 4) != 0)) {
    return;
  }
  bVar2 = IR::PropertySymOpnd::HasObjectTypeSym(this_03);
  if (!bVar2) {
    return;
  }
  pSVar7 = IR::PropertySymOpnd::GetObjectTypeSym(this_03);
  if (pSVar7 == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x836,"(typeSym)","typeSym");
    if (!bVar2) goto LAB_0046dce0;
    *puVar6 = 0;
  }
  pVVar8 = GlobOptBlockData::FindObjectTypeValue(&this->currentBlock->globOptData,pSVar7);
  if (pVVar8 == (Value *)0x0) {
    return;
  }
  pJVar9 = ValueInfo::AsJsType(pVVar8->valueInfo);
  local_48.t = (pJVar9->jsType).t;
  type.t = (Type)0x0;
  bVar2 = JITTypeHolderBase<void>::operator!=(&local_48,&type.t);
  if (bVar2) {
    pJVar10 = JITTypeHolderBase<void>::operator->(&local_48);
    TVar4 = JITType::GetTypeId(pJVar10);
    bVar2 = Js::DynamicType::Is(TVar4);
    if (bVar2) {
      pJVar10 = JITTypeHolderBase<void>::operator->(&local_48);
      pJVar11 = JITType::GetTypeHandler(pJVar10);
      bVar2 = JITTypeHandler::IsLocked(pJVar11);
      if (!bVar2) {
        return;
      }
    }
  }
  else {
    this_01 = pJVar9->jsTypeSet;
    if (this_01 == (EquivalentTypeSet *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x849,"(typeSet)","typeSet");
      if (!bVar2) goto LAB_0046dce0;
      *puVar6 = 0;
    }
    for (index = 0; index < this_01->count; index = index + 1) {
      local_48.t = (Type)Js::EquivalentTypeSet::GetType(this_01,index);
      pJVar10 = JITTypeHolderBase<void>::operator->(&local_48);
      TVar4 = JITType::GetTypeId(pJVar10);
      bVar2 = Js::DynamicType::Is(TVar4);
      if (bVar2) {
        pJVar10 = JITTypeHolderBase<void>::operator->(&local_48);
        pJVar11 = JITType::GetTypeHandler(pJVar10);
        bVar2 = JITTypeHandler::IsLocked(pJVar11);
        if (!bVar2) {
          return;
        }
      }
    }
  }
  type.t = (Type)0x0;
  bVar2 = JITTypeHolderBase<void>::operator!=(&local_48,&type.t);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x855,"(type != nullptr)","type != nullptr");
    if (!bVar2) {
LAB_0046dce0:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  pJVar10 = JITTypeHolderBase<void>::operator->(&local_48);
  TVar4 = JITType::GetTypeId(pJVar10);
  BVar5 = Js::TypedArrayBase::Is(TVar4);
  if (BVar5 == 0) {
    VVar3 = ValueType::FromTypeId(TVar4,false);
    type.t._0_2_ = VVar3.field_0;
    bVar2 = ValueType::operator==((ValueType *)&type,(ValueType)0x9);
    if (((TVar4 == TypeIds_Array) && (bVar2)) && (bVar2 = DoArrayCheckHoist(this), bVar2)) {
      loop = this->currentBlock->loop;
      if (loop == (Loop *)0x0) {
        bVar2 = ImplicitCallFlagsAllowOpts(this->func);
      }
      else {
        bVar2 = ImplicitCallFlagsAllowOpts(loop);
      }
      if ((bVar2 != false) &&
         ((bVar2 = ValueType::IsLikelyArrayOrObjectWithArray((ValueType *)&local_32[0].field_0),
          !bVar2 || (bVar2 = ValueType::HasNoMissingValues((ValueType *)&local_32[0].field_0),
                    !bVar2)))) {
        local_34.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::GetObject(Array);
        VVar3 = ValueType::SetArrayTypeId((ValueType *)&local_34.field_0,TypeIds_Array);
        type.t._0_2_ = VVar3.field_0;
      }
    }
    bVar2 = ValueType::operator!=((ValueType *)&type,(ValueType)0x9);
    if (bVar2) {
      ChangeValueType(this,this->currentBlock,value,type.t._0_2_,false,true);
    }
    return;
  }
  return;
}

Assistant:

void
GlobOpt::UpdateObjPtrValueType(IR::Opnd * opnd, IR::Instr * instr)
{
    if (!opnd->IsSymOpnd() || !opnd->AsSymOpnd()->IsPropertySymOpnd())
    {
        return;
    }

    if (!instr->HasTypeCheckBailOut())
    {
        // No type check bailout, we didn't check that type of the object pointer.
        return;
    }

    // Only check that fixed field should have type check bailout in loop prepass.
    Assert(instr->m_opcode == Js::OpCode::CheckFixedFld || !this->IsLoopPrePass());

    if (instr->m_opcode != Js::OpCode::CheckFixedFld)
    {
        // DeadStore pass may remove type check bailout, except CheckFixedFld which always needs
        // type check bailout. So we can only change the type for CheckFixedFld.
        // Consider: See if we can expand that in the future.
        return;
    }

    IR::PropertySymOpnd * propertySymOpnd = opnd->AsPropertySymOpnd();
    StackSym * objectSym = propertySymOpnd->GetObjectSym();
    Value * objVal = this->currentBlock->globOptData.FindValue(objectSym);
    if (!objVal)
    {
        return;
    }

    ValueType objValueType = objVal->GetValueInfo()->Type();
    if (objValueType.IsDefinite())
    {
        return;
    }

    ValueInfo *objValueInfo = objVal->GetValueInfo();

    // It is possible for a valueInfo to be not definite and still have a byteCodeConstant as symStore, this is because we conservatively copy valueInfo in prePass
    if (objValueInfo->GetSymStore() && objValueInfo->GetSymStore()->IsStackSym() && objValueInfo->GetSymStore()->AsStackSym()->IsFromByteCodeConstantTable())
    {
        return;
    }

    // Verify that the types we're checking for here have been locked so that the type ID's can't be changed
    // without changing the type.
    if (!propertySymOpnd->HasObjectTypeSym())
    {
        return;
    }

    StackSym * typeSym = propertySymOpnd->GetObjectTypeSym();
    Assert(typeSym);
    Value * typeValue = currentBlock->globOptData.FindObjectTypeValue(typeSym);
    if (!typeValue)
    {
        return;
    }
    JsTypeValueInfo * typeValueInfo = typeValue->GetValueInfo()->AsJsType();
    JITTypeHolder type = typeValueInfo->GetJsType();
    if (type != nullptr)
    {
        if (Js::DynamicType::Is(type->GetTypeId()) &&
            !type->GetTypeHandler()->IsLocked())
        {
            return;
        }
    }
    else
    {
        Js::EquivalentTypeSet * typeSet = typeValueInfo->GetJsTypeSet();
        Assert(typeSet);
        for (uint16 i = 0; i < typeSet->GetCount(); i++)
        {
            type = typeSet->GetType(i);
            if (Js::DynamicType::Is(type->GetTypeId()) &&
                !type->GetTypeHandler()->IsLocked())
            {
                return;
            }
        }
    }

    AnalysisAssert(type != nullptr);
    Js::TypeId typeId = type->GetTypeId();

    if (Js::TypedArrayBase::Is(typeId))
    {
        // Type ID does not allow us to distinguish between virtual and non-virtual typed array.
        return;
    }

    // Passing false for useVirtual as we would never have a virtual typed array hitting this code path
    ValueType newValueType = ValueType::FromTypeId(typeId, false);

    if (newValueType == ValueType::Uninitialized)
    {
        switch (typeId)
        {
        default:
            // Can't mark as definite object because it may actually be object-with-array.
            // Consider: a value type that subsumes object, array, and object-with-array.
            break;
        case Js::TypeIds_NativeIntArray:
        case Js::TypeIds_NativeFloatArray:
            // Do not mark these values as definite to protect against array conversion
            break;
        case Js::TypeIds_Array:
            // Because array can change type id, we can only make it definite if we are doing array check hoist
            // so that implicit call will be installed between the array checks.
            if (!DoArrayCheckHoist() ||
                (currentBlock->loop
                ? !this->ImplicitCallFlagsAllowOpts(currentBlock->loop)
                : !this->ImplicitCallFlagsAllowOpts(this->func)))
            {
                break;
            }
            if (objValueType.IsLikelyArrayOrObjectWithArray())
            {
                // If we have likely no missing values before, keep the likely, because, we haven't proven that
                // the array really has no missing values
                if (!objValueType.HasNoMissingValues())
                {
                    newValueType = ValueType::GetObject(ObjectType::Array).SetArrayTypeId(typeId);
                }
            }
            else
            {
                newValueType = ValueType::GetObject(ObjectType::Array).SetArrayTypeId(typeId);
            }
            break;
        }
    }
    if (newValueType != ValueType::Uninitialized)
    {
        ChangeValueType(currentBlock, objVal, newValueType, false, true);
    }
}